

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O2

void __thiscall Noise::addNoise(Noise *this)

{
  ParameterSet *pPVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Noise *pNVar4;
  bool bVar5;
  VertexHandle VVar6;
  long lVar7;
  Point *pPVar8;
  Normal *pNVar9;
  int number;
  int i_1;
  long lVar10;
  int number_00;
  int i;
  long lVar11;
  double StandardDerivation;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  EdgeIter EVar14;
  VertexIter VVar15;
  undefined1 local_310 [8];
  TriMesh mesh;
  double noise_level;
  double impulsive_level;
  double dStack_d0;
  undefined1 auStack_c8 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  RandomDirections;
  undefined1 auStack_a8 [8];
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
  VertexListAndGaussianNumbers;
  int local_88;
  int local_84;
  int noise_type_index;
  int noise_direction_index;
  undefined1 local_78 [8];
  VertexIter v_it;
  vector<double,_std::allocator<double>_> GaussianNumbers;
  Point p;
  
  OpenMesh::TriMesh_ArrayKernelT<MyTraits>::TriMesh_ArrayKernelT
            ((TriMesh_ArrayKernelT<MyTraits> *)local_310,&this->data_manager_->mesh_);
  uVar3 = mesh.super_Mesh.
          super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
          .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
          ._168_8_;
  uVar2 = mesh.super_Mesh.
          super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
          .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
          ._160_8_;
  OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)local_310);
  if (uVar3 != uVar2) {
    pPVar1 = this->parameter_set_;
    std::__cxx11::string::string((string *)local_310,"Noise level",(allocator *)&v_it.hnd_);
    bVar5 = ParameterSet::getValue
                      (pPVar1,(string *)local_310,
                       (double *)
                       &mesh.super_Mesh.
                        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                        .
                        super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        .refcount_fcolors_);
    std::__cxx11::string::~string((string *)local_310);
    if (bVar5) {
      pPVar1 = this->parameter_set_;
      std::__cxx11::string::string((string *)local_310,"Impulsive level",(allocator *)&v_it.hnd_);
      bVar5 = ParameterSet::getValue(pPVar1,(string *)local_310,&noise_level);
      std::__cxx11::string::~string((string *)local_310);
      if (bVar5) {
        pPVar1 = this->parameter_set_;
        std::__cxx11::string::string((string *)local_310,"Noise type",(allocator *)&v_it.hnd_);
        bVar5 = ParameterSet::getValue(pPVar1,(string *)local_310,&local_88);
        std::__cxx11::string::~string((string *)local_310);
        if (bVar5) {
          pPVar1 = this->parameter_set_;
          std::__cxx11::string::string
                    ((string *)local_310,"Noise direction",(allocator *)&v_it.hnd_);
          bVar5 = ParameterSet::getValue(pPVar1,(string *)local_310,&local_84);
          std::__cxx11::string::~string((string *)local_310);
          if (bVar5) {
            DataManager::MeshToOriginalMesh(this->data_manager_);
            _noise_type_index = this;
            OpenMesh::TriMesh_ArrayKernelT<MyTraits>::TriMesh_ArrayKernelT
                      ((TriMesh_ArrayKernelT<MyTraits> *)local_310,&this->data_manager_->mesh_);
            join_0x00000010_0x00000000_ =
                 OpenMesh::PolyConnectivity::edges_begin((PolyConnectivity *)local_310);
            p.super_VectorDataT<double,_3>.values_[2] = 0.0;
            while( true ) {
              EVar14 = OpenMesh::PolyConnectivity::edges_end((PolyConnectivity *)local_310);
              if ((BaseHandle)
                  GaussianNumbers.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start._0_4_ ==
                  EVar14.hnd_.super_BaseHandle.idx_.super_BaseHandle &&
                  (mesh_ptr)v_it._8_8_ == EVar14.mesh_) break;
              impulsive_level =
                   OpenMesh::
                   PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                   ::calc_edge_length((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                       *)local_310,
                                      (EdgeHandle)
                                      GaussianNumbers.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start._0_4_);
              OpenMesh::Iterators::
              GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
              ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                            *)&v_it.hnd_,0);
              p.super_VectorDataT<double,_3>.values_[2] =
                   p.super_VectorDataT<double,_3>.values_[2] + impulsive_level;
            }
            lVar7 = (long)(mesh.super_Mesh.
                           super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                           .
                           super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           ._192_8_ -
                          mesh.super_Mesh.
                          super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                          .
                          super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                          ._184_8_) >> 5;
            auVar12._8_4_ =
                 (int)((long)(mesh.super_Mesh.
                              super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                              .
                              super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                              ._192_8_ -
                             mesh.super_Mesh.
                             super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                             .
                             super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                             ._184_8_) >> 0x25);
            auVar12._0_8_ = lVar7;
            auVar12._12_4_ = 0x45300000;
            StandardDerivation =
                 (p.super_VectorDataT<double,_3>.values_[2] /
                 ((auVar12._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) *
                 (double)mesh.super_Mesh.
                         super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                         .
                         super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                         ._544_8_;
            lVar7 = (long)(mesh.super_Mesh.
                           super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                           .
                           super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           ._168_8_ -
                          mesh.super_Mesh.
                          super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                          .
                          super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                          ._160_8_) >> 2;
            auVar13._8_4_ =
                 (int)((long)(mesh.super_Mesh.
                              super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                              .
                              super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                              ._168_8_ -
                             mesh.super_Mesh.
                             super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                             .
                             super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                             ._160_8_) >> 0x22);
            auVar13._0_8_ = lVar7;
            auVar13._12_4_ = 0x45300000;
            dStack_d0 = auVar13._8_8_ - 1.9342813113834067e+25;
            impulsive_level =
                 (dStack_d0 + ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) *
                 noise_level;
            OpenMesh::
            AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
            request_face_normals
                      ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        *)local_310);
            OpenMesh::
            AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
            request_vertex_normals
                      ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        *)local_310);
            OpenMesh::
            PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
            ::update_normals((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                              *)local_310);
            pNVar4 = _noise_type_index;
            GaussianNumbers.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            RandomDirections.
            super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            VertexListAndGaussianNumbers.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            stack0xffffffffffffff98 = (EdgeIter)ZEXT816(0);
            auStack_c8 = (undefined1  [8])0x0;
            RandomDirections.
            super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            auStack_a8 = (undefined1  [8])0x0;
            VertexListAndGaussianNumbers.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            number = (int)((ulong)(mesh.super_Mesh.
                                   super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                   .
                                   super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                   ._168_8_ -
                                  mesh.super_Mesh.
                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                  .
                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                  ._160_8_) >> 2);
            if (local_88 == 0) {
              randomGaussianNumbers
                        (_noise_type_index,0.0,StandardDerivation,number,
                         (vector<double,_std::allocator<double>_> *)&v_it.hnd_);
              if (local_84 == 0) {
                _local_78 = OpenMesh::PolyConnectivity::vertices_begin
                                      ((PolyConnectivity *)local_310);
                while( true ) {
                  VVar15 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)local_310);
                  if ((BaseHandle)v_it.mesh_._0_4_ ==
                      VVar15.hnd_.super_BaseHandle.idx_.super_BaseHandle &&
                      local_78 == (undefined1  [8])VVar15.mesh_) break;
                  pPVar8 = OpenMesh::
                           AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                    *)local_310,(VertexHandle)v_it.mesh_._0_4_);
                  pNVar9 = OpenMesh::
                           AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           ::normal((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                     *)local_310,(VertexHandle)v_it.mesh_._0_4_);
                  GaussianNumbers.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)((pNVar9->super_VectorDataT<double,_3>).values_[0] *
                                 *(double *)(v_it._8_8_ + (long)v_it.mesh_._0_4_ * 8) +
                                (pPVar8->super_VectorDataT<double,_3>).values_[0]);
                  OpenMesh::
                  AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                  ::set_point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                               *)local_310,(VertexHandle)v_it.mesh_._0_4_,
                              (Point *)&GaussianNumbers.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage);
                  OpenMesh::Iterators::
                  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                  ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                *)local_78,0);
                }
              }
              else {
                randomDirections(pNVar4,(int)((ulong)(mesh.super_Mesh.
                                                                                                            
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                                  ._168_8_ -
                                                  mesh.super_Mesh.
                                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                                  .
                                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                                  ._160_8_) >> 2),
                                 (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  *)auStack_c8);
                _local_78 = OpenMesh::PolyConnectivity::vertices_begin
                                      ((PolyConnectivity *)local_310);
                while( true ) {
                  VVar15 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)local_310);
                  if ((BaseHandle)v_it.mesh_._0_4_ ==
                      VVar15.hnd_.super_BaseHandle.idx_.super_BaseHandle &&
                      local_78 == (undefined1  [8])VVar15.mesh_) break;
                  lVar7 = (long)v_it.mesh_._0_4_;
                  pPVar8 = OpenMesh::
                           AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                    *)local_310,(VertexHandle)v_it.mesh_._0_4_);
                  GaussianNumbers.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)((((pointer)((long)auStack_c8 + lVar7 * 0x18))->
                                 super_VectorDataT<double,_3>).values_[0] *
                                 *(double *)(v_it._8_8_ + lVar7 * 8) +
                                (pPVar8->super_VectorDataT<double,_3>).values_[0]);
                  OpenMesh::
                  AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                  ::set_point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                               *)local_310,(VertexHandle)v_it.mesh_._0_4_,
                              (Point *)&GaussianNumbers.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage);
                  OpenMesh::Iterators::
                  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                  ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                *)local_78,0);
                }
              }
            }
            else {
              number_00 = (int)impulsive_level;
              randomImpulsiveNumbers
                        (_noise_type_index,0,number + -1,number_00,0.0,StandardDerivation,
                         (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                         )auStack_a8);
              if (local_84 == 0) {
                lVar10 = 0;
                for (lVar7 = 0;
                    lVar7 < (int)((ulong)((long)VertexListAndGaussianNumbers.
                                                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start -
                                         (long)auStack_a8) >> 4); lVar7 = lVar7 + 1) {
                  VVar6 = OpenMesh::ArrayKernel::vertex_handle
                                    ((ArrayKernel *)local_310,
                                     *(uint *)((long)(int *)auStack_a8 + lVar10));
                  pPVar8 = OpenMesh::
                           AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                    *)local_310,(VertexHandle)VVar6.super_BaseHandle.idx_);
                  pNVar9 = OpenMesh::
                           AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           ::normal((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                     *)local_310,(VertexHandle)VVar6.super_BaseHandle.idx_);
                  GaussianNumbers.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)((pNVar9->super_VectorDataT<double,_3>).values_[0] *
                                 *(double *)((long)((long)auStack_a8 + 8) + lVar10) +
                                (pPVar8->super_VectorDataT<double,_3>).values_[0]);
                  OpenMesh::
                  AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                  ::set_point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                               *)local_310,(VertexHandle)VVar6.super_BaseHandle.idx_,
                              (Point *)&GaussianNumbers.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage);
                  lVar10 = lVar10 + 0x10;
                }
              }
              else {
                randomDirections(pNVar4,number_00,
                                 (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  *)auStack_c8);
                lVar7 = 0x10;
                lVar10 = 0;
                for (lVar11 = 0;
                    lVar11 < (int)((ulong)((long)VertexListAndGaussianNumbers.
                                                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start -
                                          (long)auStack_a8) >> 4); lVar11 = lVar11 + 1) {
                  VVar6 = OpenMesh::ArrayKernel::vertex_handle
                                    ((ArrayKernel *)local_310,
                                     *(uint *)((long)(int *)auStack_a8 + lVar10));
                  pPVar8 = OpenMesh::
                           AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                    *)local_310,(VertexHandle)VVar6.super_BaseHandle.idx_);
                  GaussianNumbers.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)(*(double *)
                                  ((long)((VectorDataT<double,_3> *)auStack_c8)->values_ +
                                  lVar7 + -0x10) *
                                 *(double *)((long)((long)auStack_a8 + 8) + lVar10) +
                                (pPVar8->super_VectorDataT<double,_3>).values_[0]);
                  OpenMesh::
                  AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                  ::set_point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                               *)local_310,(VertexHandle)VVar6.super_BaseHandle.idx_,
                              (Point *)&GaussianNumbers.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage);
                  lVar10 = lVar10 + 0x10;
                  lVar7 = lVar7 + 0x18;
                }
              }
            }
            pNVar4 = _noise_type_index;
            OpenMesh::
            AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
            operator=((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       *)&_noise_type_index->data_manager_->mesh_,
                      (AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       *)local_310);
            OpenMesh::
            AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
            operator=((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       *)&pNVar4->data_manager_->noisy_mesh_,
                      (AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       *)local_310);
            OpenMesh::
            AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
            operator=((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       *)&pNVar4->data_manager_->denoised_mesh_,
                      (AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                       *)local_310);
            std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            ~_Vector_base((_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)auStack_a8);
            std::
            _Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
            ::~_Vector_base((_Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                             *)auStack_c8);
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                      ((_Vector_base<double,_std::allocator<double>_> *)&v_it.hnd_);
            OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)local_310);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Noise::addNoise()
{
    if(data_manager_->getMesh().n_vertices() == 0)
        return;

    // get parameters
    double noise_level, impulsive_level;
    if(!parameter_set_->getValue(string("Noise level"), noise_level))
        return;
    if(!parameter_set_->getValue(string("Impulsive level"), impulsive_level))
        return;

    int noise_type_index, noise_direction_index;
    if(!parameter_set_->getValue(string("Noise type"), noise_type_index))
        return;
    if(!parameter_set_->getValue(string("Noise direction"), noise_direction_index))
        return;

    data_manager_->MeshToOriginalMesh();

    NoiseType noise_type = (noise_type_index == 0)? kGaussian : kImpulsive;
    NoiseDirection noise_direction = (noise_direction_index == 0)? kNormal : kRandom;

    // compute average length of mesh
    double average_length = 0.0;
    TriMesh mesh = data_manager_->getMesh();
    for(TriMesh::EdgeIter e_it = mesh.edges_begin(); e_it != mesh.edges_end(); e_it++)
        average_length += mesh.calc_edge_length(*e_it);
    double edge_numbers = (double)mesh.n_edges();
    average_length /= edge_numbers;

    // add noise
    double standard_derivation = average_length * noise_level;
    int impulsive_vertex_number = (int)(mesh.n_vertices() * impulsive_level);

    mesh.request_face_normals();
    mesh.request_vertex_normals();
    mesh.update_normals();

    std::vector<double> GaussianNumbers;
    std::vector<TriMesh::Normal> RandomDirections;
    std::vector<std::pair<int, double> > VertexListAndGaussianNumbers;

    if(noise_type == kGaussian){
        randomGaussianNumbers(0, standard_derivation, (int)mesh.n_vertices(), GaussianNumbers);
        if(noise_direction == kNormal){
            for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++){

                TriMesh::Point p = mesh.point(*v_it) + mesh.normal(*v_it) * GaussianNumbers[v_it->idx()];
                mesh.set_point(*v_it, p);
            }
        }
        else if(noise_direction == kRandom){
            randomDirections((int)mesh.n_vertices(), RandomDirections);
            for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++){
                int index = v_it->idx();
                TriMesh::Point p = mesh.point(*v_it) + RandomDirections[index] * GaussianNumbers[index];
                mesh.set_point(*v_it, p);
            }
        }
    }
    else if(noise_type == kImpulsive){
        randomImpulsiveNumbers(0,(int)mesh.n_vertices() - 1, impulsive_vertex_number, 0, standard_derivation, VertexListAndGaussianNumbers);
        if(noise_direction == kNormal){
            for(int i = 0; i < (int)VertexListAndGaussianNumbers.size(); i++){
                int index = VertexListAndGaussianNumbers[i].first;
                TriMesh::VertexHandle vh = mesh.vertex_handle(index);
                TriMesh::Point p =  mesh.point(vh) + mesh.normal(vh) * VertexListAndGaussianNumbers[i].second;
                mesh.set_point(vh, p);
            }
        }
        else if(noise_direction == kRandom){
            randomDirections(impulsive_vertex_number, RandomDirections);
            for(int i = 0; i < (int)VertexListAndGaussianNumbers.size(); i++){
                int index = VertexListAndGaussianNumbers[i].first;
                TriMesh::VertexHandle vh = mesh.vertex_handle(index);
                TriMesh::Point p =  mesh.point(vh) + RandomDirections[i] * VertexListAndGaussianNumbers[i].second;
                mesh.set_point(vh, p);
            }
        }
    }

    data_manager_->setMesh(mesh);
    data_manager_->setNoisyMesh(mesh);
    data_manager_->setDenoisedMesh(mesh);
}